

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_pcrv_tec_zone(REF_GRID ref_grid,REF_INT edgeid,REF_INT faceid,REF_INT sense,FILE *file)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  FILE *pFVar10;
  REF_INT geom;
  char *pcVar11;
  int iVar12;
  int iVar13;
  REF_GEOM pRVar14;
  REF_DBL *pRVar15;
  ulong uVar16;
  REF_INT node;
  uint local_150;
  REF_INT local;
  REF_GEOM local_148;
  uint local_140;
  REF_INT sens;
  REF_DICT ref_dict;
  REF_DBL radius;
  REF_INT local_124;
  FILE *local_120;
  ulong local_118;
  REF_DBL *local_110;
  void *local_108;
  REF_DBL gap;
  REF_DBL tvalue;
  int local_ec;
  REF_DBL xyz [3];
  REF_INT nodes [27];
  REF_DBL normal [3];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[0];
  pRVar14 = ref_grid->geom;
  local_124 = sense;
  local_120 = (FILE *)file;
  uVar3 = ref_dict_create(&ref_dict);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xc17,
           "ref_geom_pcrv_tec_zone",(ulong)uVar3,"create dict");
    return uVar3;
  }
  local_148 = pRVar14;
  local_140 = faceid;
  if (pRVar14->max < 1) {
    iVar13 = -1;
  }
  else {
    uVar7 = 0xffffffff;
    lVar9 = 0;
    uVar16 = 0;
    do {
      pRVar1 = pRVar14->descr;
      if ((*(int *)((long)pRVar1 + lVar9) == 1) && (*(int *)((long)pRVar1 + lVar9 + 4) == edgeid)) {
        uVar3 = ref_dict_store(ref_dict,*(REF_INT *)((long)pRVar1 + lVar9 + 0x14),(REF_INT)uVar16);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xc1c,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"mark nodes");
          return uVar3;
        }
        pRVar14 = local_148;
        if (*(int *)((long)local_148->descr + lVar9 + 0xc) != 0) {
          if ((int)uVar7 != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xc1e,"ref_geom_pcrv_tec_zone","should be only one jump per edge",
                   0xffffffffffffffff,(long)(int)uVar7);
            return 1;
          }
          uVar7 = uVar16 & 0xffffffff;
        }
      }
      iVar13 = (int)uVar7;
      uVar16 = uVar16 + 1;
      lVar9 = lVar9 + 0x18;
    } while ((long)uVar16 < (long)pRVar14->max);
  }
  local_118 = (ulong)((uint)(iVar13 != -1) + ref_dict->n);
  if (ref_cell->max < 1) {
    uVar3 = 0;
  }
  else {
    iVar12 = 0;
    uVar3 = 0;
    do {
      RVar4 = ref_cell_nodes(ref_cell,iVar12,nodes);
      uVar3 = uVar3 + (nodes[2] == edgeid && RVar4 == 0);
      iVar12 = iVar12 + 1;
    } while (iVar12 < ref_cell->max);
  }
  uVar7 = local_118;
  iVar12 = (int)local_118;
  if ((iVar12 == 0) || (uVar3 == 0)) {
    uVar3 = ref_dict_free(ref_dict);
    if (uVar3 == 0) {
      return 0;
    }
    uVar8 = 0xc2f;
LAB_00168819:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
           "ref_geom_pcrv_tec_zone",(ulong)uVar3,"free dict");
  }
  else {
    fprintf(local_120,"zone t=\"pcrv%df%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
            (ulong)(uint)edgeid,(ulong)local_140,local_118 & 0xffffffff,(ulong)uVar3,"point",
            "felineseg");
    if (iVar12 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xc38,
             "ref_geom_pcrv_tec_zone","malloc t of REF_DBL negative");
      return 1;
    }
    pvVar5 = malloc((uVar7 & 0xffffffff) << 3);
    if (pvVar5 == (void *)0x0) {
      pcVar11 = "malloc t of REF_DBL NULL";
      uVar8 = 0xc38;
    }
    else {
      local_110 = (REF_DBL *)malloc((ulong)(uint)(iVar12 * 2) << 3);
      if (local_110 != (REF_DBL *)0x0) {
        pFVar10 = local_120;
        local_108 = pvVar5;
        if (0 < ref_cell->max) {
          local_ec = iVar12 + -1;
          iVar12 = 0;
          local_150 = 0;
          do {
            RVar4 = ref_cell_nodes(ref_cell,iVar12,nodes);
            if ((RVar4 == 0) && (nodes[2] == edgeid)) {
              uVar3 = ref_dict_location(ref_dict,nodes[0],&local);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc40,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"localize");
                printf("edg %d %d id %d no edge geom\n",(ulong)(uint)nodes[0],(ulong)(uint)nodes[1],
                       (ulong)(uint)nodes[2]);
                local_150 = ref_node_location(ref_node,nodes[0]);
                pvVar5 = local_108;
                if (local_150 == 0) {
                  ref_geom_tattle(local_148,nodes[0]);
                  local_150 = uVar3;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc3e,"ref_geom_pcrv_tec_zone",(ulong)local_150,"loc");
                  pvVar5 = local_108;
                }
              }
              if (uVar3 != 0) {
                return local_150;
              }
              uVar3 = ref_geom_cell_tuv(local_148,nodes[0],nodes,1,&tvalue,&sens);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc43,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"from");
                return uVar3;
              }
              if (sens == -1) {
                local = local_ec;
              }
              *(REF_DBL *)((long)pvVar5 + (long)local * 8) = tvalue;
              uVar3 = ref_egads_edge_face_uv
                                (local_148,edgeid,local_140,local_124,tvalue,
                                 local_110 + (long)local * 2);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc48,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"p-curve uv");
                return uVar3;
              }
              uVar3 = ref_dict_location(ref_dict,nodes[1],&local);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc49,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"localize");
                return uVar3;
              }
              uVar3 = ref_geom_cell_tuv(local_148,nodes[1],nodes,1,&tvalue,&sens);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc4c,"ref_geom_pcrv_tec_zone",(ulong)uVar3);
                return uVar3;
              }
              if (sens == -1) {
                local = local_ec;
              }
              *(REF_DBL *)((long)pvVar5 + (long)local * 8) = tvalue;
              RVar4 = ref_egads_edge_face_uv
                                (local_148,edgeid,local_140,local_124,tvalue,
                                 local_110 + (long)local * 2);
              pFVar10 = local_120;
              if (RVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc51,"ref_geom_pcrv_tec_zone");
                return RVar4;
              }
            }
            iVar12 = iVar12 + 1;
          } while (iVar12 < ref_cell->max);
        }
        geom = -1;
        node = -1;
        if (0 < ref_dict->n) {
          node = *ref_dict->key;
          geom = *ref_dict->value;
        }
        if (0 < ref_dict->n) {
          pRVar15 = local_110;
          lVar9 = 0;
          do {
            radius = 0.0;
            gap = 0.0;
            pRVar2 = ref_node->real;
            lVar6 = (long)(node * 0xf);
            xyz[0] = pRVar2[lVar6];
            xyz[1] = pRVar2[lVar6 + 1];
            xyz[2] = pRVar2[lVar6 + 2];
            if (local_148->model != (void *)0x0) {
              uVar3 = ref_egads_edge_curvature(local_148,geom,&radius,normal);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc5c,"ref_geom_pcrv_tec_zone",(ulong)uVar3);
                return uVar3;
              }
              if (radius <= -radius) {
                radius = -radius;
              }
              uVar3 = ref_egads_edge_face_uv
                                (local_148,edgeid,local_140,local_124,
                                 *(REF_DBL *)((long)local_108 + lVar9 * 8),pRVar15);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc60,"ref_geom_pcrv_tec_zone",(ulong)uVar3);
                return uVar3;
              }
              RVar4 = ref_egads_eval_at(local_148,2,local_140,pRVar15,xyz,(REF_DBL *)0x0);
              if (RVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc63,"ref_geom_pcrv_tec_zone");
                return RVar4;
              }
              RVar4 = ref_egads_gap(local_148,node,&gap);
              pFVar10 = local_120;
              if (RVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc64,"ref_geom_pcrv_tec_zone");
                return RVar4;
              }
            }
            fprintf(pFVar10," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",xyz[0],xyz[1],
                    xyz[2],gap,*pRVar15,pRVar15[1],radius,
                    *(undefined8 *)((long)local_108 + lVar9 * 8));
            lVar6 = lVar9 + 1;
            geom = -1;
            node = -1;
            if (lVar6 < ref_dict->n) {
              node = ref_dict->key[lVar9 + 1];
              geom = ref_dict->value[lVar9 + 1];
            }
            pRVar15 = pRVar15 + 2;
            lVar9 = lVar6;
          } while (lVar6 < ref_dict->n);
        }
        pvVar5 = local_108;
        pRVar15 = local_110;
        if (iVar13 != -1) {
          iVar12 = local_148->descr[(long)(iVar13 * 6) + 5];
          lVar9 = (long)iVar12;
          radius = 0.0;
          gap = 0.0;
          pRVar15 = ref_node->real;
          xyz[0] = pRVar15[lVar9 * 0xf];
          xyz[1] = pRVar15[lVar9 * 0xf + 1];
          xyz[2] = pRVar15[lVar9 * 0xf + 2];
          if (local_148->model != (void *)0x0) {
            uVar3 = ref_egads_edge_curvature(local_148,iVar13,&radius,normal);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xc73,"ref_geom_pcrv_tec_zone",(ulong)uVar3);
              return uVar3;
            }
            if (radius <= -radius) {
              radius = -radius;
            }
            pRVar15 = local_110 + ((int)local_118 * 2 - 2);
            uVar3 = ref_egads_edge_face_uv
                              (local_148,edgeid,local_140,local_124,
                               *(REF_DBL *)((long)pvVar5 + (ulong)((int)local_118 - 1) * 8),pRVar15)
            ;
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xc77,"ref_geom_pcrv_tec_zone",(ulong)uVar3);
              return uVar3;
            }
            uVar3 = ref_egads_eval_at(local_148,2,local_140,pRVar15,xyz,(REF_DBL *)0x0);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xc7a,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"eval at");
              return uVar3;
            }
            uVar3 = ref_egads_gap(local_148,iVar12,&gap);
            pFVar10 = local_120;
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xc7b,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"gap");
              return uVar3;
            }
          }
          pRVar15 = local_110;
          uVar7 = (ulong)((int)local_118 * 2 - 2);
          fprintf(pFVar10," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",xyz[0],xyz[1],xyz[2],
                  gap,local_110[uVar7],local_110[uVar7 + 1],radius,
                  *(undefined8 *)((long)pvVar5 + (ulong)((int)local_118 - 1) * 8));
        }
        free(pRVar15);
        free(pvVar5);
        if (0 < ref_cell->max) {
          local_118 = (ulong)((int)local_118 - 1);
          iVar13 = 0;
          do {
            RVar4 = ref_cell_nodes(ref_cell,iVar13,nodes);
            if ((RVar4 == 0) && (nodes[2] == edgeid)) {
              uVar3 = ref_dict_location(ref_dict,nodes[0],&local);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc87,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"localize");
                return uVar3;
              }
              uVar3 = ref_geom_cell_tuv(local_148,nodes[0],nodes,1,&tvalue,&sens);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc8a,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"from");
                return uVar3;
              }
              if (sens == -1) {
                local = (REF_INT)local_118;
              }
              fprintf(local_120," %d",(ulong)(local + 1));
              uVar3 = ref_dict_location(ref_dict,nodes[1],&local);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc8d,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"localize");
                return uVar3;
              }
              uVar3 = ref_geom_cell_tuv(local_148,nodes[1],nodes,1,&tvalue,&sens);
              pFVar10 = local_120;
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xc90,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"from");
                return uVar3;
              }
              if (sens == -1) {
                local = (REF_INT)local_118;
              }
              fprintf(local_120," %d",(ulong)(local + 1));
              fputc(10,pFVar10);
            }
            iVar13 = iVar13 + 1;
          } while (iVar13 < ref_cell->max);
        }
        uVar3 = ref_dict_free(ref_dict);
        if (uVar3 == 0) {
          return 0;
        }
        uVar8 = 0xc97;
        goto LAB_00168819;
      }
      pcVar11 = "malloc uv of REF_DBL NULL";
      uVar8 = 0xc39;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
           "ref_geom_pcrv_tec_zone",pcVar11);
    uVar3 = 2;
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_pcrv_tec_zone(REF_GRID ref_grid, REF_INT edgeid,
                                          REF_INT faceid, REF_INT sense,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, nedg, sens;
  REF_INT jump_geom = REF_EMPTY;
  REF_DBL *t, *uv, tvalue;
  REF_DBL radius, normal[3], xyz[3], gap;

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_edge(ref_geom, geom) {
    if (edgeid == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
      if (0 != ref_geom_jump(ref_geom, geom)) {
        REIS(REF_EMPTY, jump_geom, "should be only one jump per edge");
        jump_geom = geom;
      }
    }
  }
  nnode = ref_dict_n(ref_dict);
  if (REF_EMPTY != jump_geom) nnode++;

  nedg = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (edgeid == nodes[2]) {
      nedg++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == nedg) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(file,
          "zone t=\"pcrv%df%d\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          edgeid, faceid, nnode, nedg, "point", "felineseg");

  ref_malloc(t, nnode, REF_DBL);
  ref_malloc(uv, 2 * nnode, REF_DBL);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (edgeid == nodes[2]) {
      RSB(ref_dict_location(ref_dict, nodes[0], &local), "localize", {
        printf("edg %d %d id %d no edge geom\n", nodes[0], nodes[1], nodes[2]);
        RSS(ref_node_location(ref_node, nodes[0]), "loc");
        RSS(ref_geom_tattle(ref_geom, nodes[0]), "tatt");
      });
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[local],
                                 &(uv[2 * local])),
          "p-curve uv");
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[local],
                                 &(uv[2 * local])),
          "p-curve uv");
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, geom, &radius, normal), "curve");
      radius = ABS(radius);
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[item],
                                 &(uv[2 * item])),
          "p-curve uv");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, faceid, &(uv[2 * item]),
                            xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * item], uv[1 + 2 * item], radius,
            t[item]);
  }
  if (REF_EMPTY != jump_geom) {
    node = ref_geom_node(ref_geom, jump_geom);
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, jump_geom, &radius, normal),
          "curve");
      radius = ABS(radius);
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[nnode - 1],
                                 &(uv[2 * (nnode - 1)])),
          "p-curve uv");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, faceid,
                            &(uv[2 * (nnode - 1)]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    node = ref_geom_node(ref_geom, jump_geom);
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * (nnode - 1)],
            uv[1 + 2 * (nnode - 1)], radius, t[nnode - 1]);
  }
  ref_free(uv);
  ref_free(t);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (edgeid == nodes[2]) {
      RSS(ref_dict_location(ref_dict, nodes[0], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}